

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test1.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  Chunk ch2;
  Chunk ch1;
  uint8_t test_riff [108];
  
  puVar2 = "RIFFd";
  puVar3 = test_riff;
  for (lVar1 = 0x6c; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *puVar2;
    puVar2 = puVar2 + 1;
    puVar3 = puVar3 + 1;
  }
  riffcpp::Chunk::Chunk(&ch1,"test.riff");
  test_chunk(&ch1);
  riffcpp::Chunk::Chunk(&ch2,test_riff,0x6c);
  test_chunk(&ch2);
  riffcpp::Chunk::~Chunk(&ch2);
  riffcpp::Chunk::~Chunk(&ch1);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
  std::uint8_t test_riff[] = {
   0x52, 0x49, 0x46, 0x46, 0x64, 0x00, 0x00, 0x00, 0x73, 0x6d, 0x70, 0x6c,
   0x4c, 0x49, 0x53, 0x54, 0x3e, 0x00, 0x00, 0x00, 0x74, 0x73, 0x74, 0x31,
   0x74, 0x65, 0x73, 0x74, 0x12, 0x00, 0x00, 0x00, 0x68, 0x65, 0x79, 0x20,
   0x74, 0x68, 0x69, 0x73, 0x20, 0x69, 0x73, 0x20, 0x61, 0x20, 0x74, 0x65,
   0x73, 0x74, 0x74, 0x65, 0x73, 0x74, 0x18, 0x00, 0x00, 0x00, 0x68, 0x65,
   0x79, 0x20, 0x74, 0x68, 0x69, 0x73, 0x20, 0x69, 0x73, 0x20, 0x61, 0x6e,
   0x6f, 0x74, 0x68, 0x65, 0x72, 0x20, 0x74, 0x65, 0x73, 0x74, 0x73, 0x65,
   0x71, 0x74, 0x12, 0x00, 0x00, 0x00, 0x74, 0x65, 0x73, 0x74, 0x0a, 0x00,
   0x00, 0x00, 0x66, 0x69, 0x6e, 0x61, 0x6c, 0x20, 0x74, 0x65, 0x73, 0x74};
  std::size_t test_riff_len = 108;

  riffcpp::Chunk ch1("test.riff");
  test_chunk(ch1);
  riffcpp::Chunk ch2(test_riff, test_riff_len);
  test_chunk(ch2);
}